

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O3

int x64CVTSI2SD(uchar *stream,x86XmmReg dst,x86Reg src)

{
  *stream = 0xf2;
  stream[1] = (7 < (int)dst) << 2 | 8 < (int)src | 0x48;
  stream[2] = '\x0f';
  stream[3] = '*';
  stream[4] = (char)dst << 3 | regCode[src] | 0xc0;
  return 5;
}

Assistant:

int x64CVTSI2SD(unsigned char *stream, x86XmmReg dst, x86Reg src)
{
	unsigned char *start = stream;

	*stream++ = 0xf2;
	stream += encodeRex(stream, true, dst, src);
	*stream++ = 0x0f;
	*stream++ = 0x2A;
	*stream++ = encodeRegister(src, dst);

	return int(stream - start);
}